

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

condition_unique_ptr_t __thiscall
so_5::disp::mpmc_queue_traits::combined_lock::actual_lock_t::allocate_condition(actual_lock_t *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  pp_Var2 = (_func_int **)operator_new(0x78);
  p_Var1 = *(_func_int **)(in_RSI + 0x10);
  *pp_Var2 = (_func_int *)&PTR__actual_cond_t_00287c90;
  pp_Var2[1] = (_func_int *)(in_RSI + 8);
  pp_Var2[2] = p_Var1;
  *(undefined1 *)(pp_Var2 + 3) = 0;
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[8] = (_func_int *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(pp_Var2 + 9));
  (this->super_lock_t)._vptr_lock_t = pp_Var2;
  return (__uniq_ptr_data<so_5::disp::mpmc_queue_traits::condition_t,_std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::mpmc_queue_traits::condition_t,_std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>,_true,_true>
            )this;
}

Assistant:

virtual condition_unique_ptr_t
		allocate_condition() override
			{
				return condition_unique_ptr_t{
					new actual_cond_t{ m_spinlock, m_waiting_time } };
			}